

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  long lVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ulong uVar7;
  ImGuiWindow *pIVar8;
  
  ppIVar1 = (GImGui->Windows).Data;
  lVar4 = (long)(GImGui->Windows).Size;
  ppIVar6 = ppIVar1;
  if (0 < lVar4) {
    do {
      if (*ppIVar6 == parent_window) break;
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 < ppIVar1 + lVar4);
  }
  if (((ulong)((long)ppIVar6 - (long)ppIVar1) >> 0x22 & 1) != 0) {
    return parent_window;
  }
  pIVar5 = parent_window;
  uVar7 = (ulong)((uint)((ulong)((long)ppIVar6 - (long)ppIVar1) >> 3) & 0x7fffffff);
  do {
    pIVar2 = ppIVar1[uVar7];
    if (((uint)pIVar2->Flags >> 0x18 & 1) == 0) {
      pIVar8 = pIVar2;
      if (pIVar2->RootWindow != parent_window) {
        while (pIVar8 != parent_window) {
          ppIVar6 = &pIVar8->ParentWindowInBeginStack;
          pIVar8 = *ppIVar6;
          if (*ppIVar6 == (ImGuiWindow *)0x0) {
            return pIVar5;
          }
        }
      }
      if (((pIVar2->Active == true) && (pIVar2->Hidden == false)) &&
         (((uint)pIVar2->Flags >> 0x19 & 1) <= (uint)(((uint)parent_window->Flags >> 0x19 & 1) != 0)
         )) {
        pIVar5 = pIVar2;
      }
    }
    bVar3 = 0 < (long)uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar3);
  return pIVar5;
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}